

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void build_paths_internal(ZNode *z,VecVecZNode *paths,int parent,int n,int n_to_go)

{
  uint uVar1;
  ZNode **ppZVar2;
  SNode *pSVar3;
  int n_00;
  VecZNode *pVVar4;
  int parent_00;
  int iVar5;
  ulong uVar6;
  ZNode *z_00;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)(uint)parent;
  pVVar4 = paths->v[parent];
  ppZVar2 = pVVar4->v;
  if (ppZVar2 == (ZNode **)0x0) {
    pVVar4->v = pVVar4->e;
    uVar1 = paths->v[parent]->n;
    paths->v[parent]->n = uVar1 + 1;
    pVVar4->e[uVar1] = z;
    goto LAB_001443a0;
  }
  uVar1 = pVVar4->n;
  if (ppZVar2 == pVVar4->e) {
    if (2 < uVar1) goto LAB_00144398;
  }
  else if ((uVar1 & 7) == 0) {
LAB_00144398:
    vec_add_internal(pVVar4,z);
    goto LAB_001443a0;
  }
  pVVar4->n = uVar1 + 1;
  ppZVar2[uVar1] = z;
LAB_001443a0:
  if (1 < n_to_go) {
    n_00 = (n - n_to_go) + 1;
    for (uVar8 = 0; uVar8 < (z->sns).n; uVar8 = uVar8 + 1) {
      iVar5 = 0;
      for (uVar6 = 0; pSVar3 = (z->sns).v[uVar8], uVar6 < (pSVar3->zns).n; uVar6 = uVar6 + 1) {
        z_00 = (pSVar3->zns).v[uVar6];
        if (z_00 != (ZNode *)0x0) {
          if (uVar8 != (uint)-iVar5) {
            parent_00 = (int)uVar7;
            if (paths->v == (VecZNode **)0x0) {
              pVVar4 = new_VecZNode(paths,n_00,parent_00);
              paths->v = paths->e;
              uVar7 = (ulong)paths->n;
              paths->n = paths->n + 1;
              paths->e[uVar7] = pVVar4;
            }
            else {
              if (paths->v == paths->e) {
                if (2 < paths->n) goto LAB_0014447b;
              }
              else if ((paths->n & 7) == 0) {
LAB_0014447b:
                pVVar4 = new_VecZNode(paths,n_00,parent_00);
                vec_add_internal(paths,pVVar4);
                uVar7 = (ulong)(paths->n - 1);
                goto LAB_0014449b;
              }
              pVVar4 = new_VecZNode(paths,n_00,parent_00);
              uVar7 = (ulong)paths->n;
              paths->n = paths->n + 1;
              paths->v[uVar7] = pVVar4;
            }
LAB_0014449b:
            z_00 = ((z->sns).v[uVar8]->zns).v[uVar6];
          }
          build_paths_internal(z_00,paths,(int)uVar7,n,n_to_go + -1);
          iVar5 = iVar5 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void build_paths_internal(ZNode *z, VecVecZNode *paths, int parent, int n, int n_to_go) {
  uint j, k, l;

  vec_add(paths->v[parent], z);
  if (n_to_go <= 1) return;
  for (k = 0; k < z->sns.n; k++)
    for (j = 0, l = 0; j < z->sns.v[k]->zns.n; j++) {
      if (z->sns.v[k]->zns.v[j]) {
        if (k + l) {
          vec_add(paths, new_VecZNode(paths, n - (n_to_go - 1), parent));
          parent = paths->n - 1;
        }
        build_paths_internal(z->sns.v[k]->zns.v[j], paths, parent, n, n_to_go - 1);
        l++;
      }
    }
}